

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIRResampler.cpp
# Opt level: O0

void __thiscall
SRCTools::FIRResampler::Constants::Constants
          (Constants *this,uint upsampleFactor,double downsampleFactor,FIRCoefficient *kernel,
          uint kernelLength)

{
  FIRCoefficient *__dest;
  ulong uVar1;
  FloatSample (*paFVar2) [2];
  double dVar3;
  FloatSample *e;
  FloatSample *s;
  uint delayLineLength;
  uint minDelayLineLength;
  FIRCoefficient *kernelCopy;
  uint kernelLength_local;
  FIRCoefficient *kernel_local;
  double downsampleFactor_local;
  uint upsampleFactor_local;
  Constants *this_local;
  
  dVar3 = floor(downsampleFactor);
  this->usePhaseInterpolation = dVar3 != downsampleFactor;
  __dest = (FIRCoefficient *)operator_new__((ulong)kernelLength << 2);
  memcpy(__dest,kernel,(ulong)kernelLength << 2);
  this->taps = __dest;
  this->numberOfTaps = kernelLength;
  this->numberOfPhases = upsampleFactor;
  this->phaseIncrement = downsampleFactor;
  dVar3 = ceil((double)kernelLength / (double)upsampleFactor);
  for (s._0_4_ = 2; (uint)s < (uint)(long)dVar3; s._0_4_ = (uint)s << 1) {
  }
  this->delayLineMask = (uint)s - 1;
  uVar1 = SUB168(ZEXT416((uint)s) * ZEXT816(8),0);
  if (SUB168(ZEXT416((uint)s) * ZEXT816(8),8) != 0) {
    uVar1 = 0xffffffffffffffff;
  }
  paFVar2 = (FloatSample (*) [2])operator_new__(uVar1);
  this->ringBuffer = paFVar2;
  paFVar2 = this->ringBuffer;
  e = *this->ringBuffer;
  while (e < paFVar2 + (uint)s) {
    *e = 0.0;
    e = e + 1;
  }
  return;
}

Assistant:

FIRResampler::Constants::Constants(const unsigned int upsampleFactor, const double downsampleFactor, const FIRCoefficient kernel[], const unsigned int kernelLength) {
	usePhaseInterpolation = downsampleFactor != floor(downsampleFactor);
	FIRCoefficient *kernelCopy = new FIRCoefficient[kernelLength];
	memcpy(kernelCopy, kernel, kernelLength * sizeof(FIRCoefficient));
	taps = kernelCopy;
	numberOfTaps = kernelLength;
	numberOfPhases = upsampleFactor;
	phaseIncrement = downsampleFactor;
	unsigned int minDelayLineLength = static_cast<unsigned int>(ceil(double(kernelLength) / upsampleFactor));
	unsigned int delayLineLength = 2;
	while (delayLineLength < minDelayLineLength) delayLineLength <<= 1;
	delayLineMask = delayLineLength - 1;
	ringBuffer = new FloatSample[delayLineLength][FIR_INTERPOLATOR_CHANNEL_COUNT];
	FloatSample *s = *ringBuffer;
	FloatSample *e = ringBuffer[delayLineLength];
	while (s < e) *(s++) = 0;
}